

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

RsRepeatSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RsRepeatSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::RsProdItemSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2,Token *args_3,
          RsProdItemSyntax *args_4)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  RsRepeatSyntax *pRVar16;
  
  pRVar16 = (RsRepeatSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RsRepeatSyntax *)this->endPtr < pRVar16 + 1) {
    pRVar16 = (RsRepeatSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pRVar16 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar1 = args->info;
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar12 = args_3->kind;
  uVar13 = args_3->field_0x2;
  NVar14.raw = (args_3->numFlags).raw;
  uVar15 = args_3->rawLen;
  pIVar3 = args_3->info;
  (pRVar16->super_RsProdSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pRVar16->super_RsProdSyntax).super_SyntaxNode.kind = RsRepeat;
  (pRVar16->keyword).kind = TVar4;
  (pRVar16->keyword).field_0x2 = uVar5;
  (pRVar16->keyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pRVar16->keyword).rawLen = uVar7;
  (pRVar16->keyword).info = pIVar1;
  (pRVar16->openParen).kind = TVar8;
  (pRVar16->openParen).field_0x2 = uVar9;
  (pRVar16->openParen).numFlags = (NumericTokenFlags)NVar10.raw;
  (pRVar16->openParen).rawLen = uVar11;
  (pRVar16->openParen).info = pIVar2;
  (pRVar16->expr).ptr = args_2;
  (pRVar16->closeParen).kind = TVar12;
  (pRVar16->closeParen).field_0x2 = uVar13;
  (pRVar16->closeParen).numFlags = (NumericTokenFlags)NVar14.raw;
  (pRVar16->closeParen).rawLen = uVar15;
  (pRVar16->closeParen).info = pIVar3;
  (pRVar16->item).ptr = args_4;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pRVar16;
  (args_4->super_RsProdSyntax).super_SyntaxNode.parent = (SyntaxNode *)pRVar16;
  return pRVar16;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }